

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_functor.cpp
# Opt level: O1

void __thiscall
product_functor<float>::product_functor(product_functor<float> *this,float a,float b)

{
  ostream *poVar1;
  char local_20 [16];
  
  this->m_a = a;
  this->m_b = b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type: ",6);
  builtin_strncpy(local_20,"float",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_20,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,". Computing the product of ",0x1b);
  poVar1 = std::ostream::_M_insert<double>((double)a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and ",5);
  poVar1 = std::ostream::_M_insert<double>((double)b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  return;
}

Assistant:

product_functor(scalar a, scalar b) : m_a(a), m_b(b)
    {
        std::cout << "Type: " << name_of_type<scalar>() << ". Computing the product of " << a << " and " << b << ".";
    }